

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

void __thiscall snestistics::Range::format(Range *this,StringBuilder *s)

{
  uint uVar1;
  int k;
  int iVar2;
  int iVar3;
  
  iVar3 = this->N;
  if (iVar3 == 0) {
    return;
  }
  if (iVar3 < 4) {
    iVar2 = 0;
    while( true ) {
      if (iVar3 + -1 <= iVar2) break;
      StringBuilder::format(s,"%X, ",(ulong)(uint)(this->step * iVar2 + this->first));
      iVar2 = iVar2 + 1;
      iVar3 = this->N;
    }
    StringBuilder::format(s,"%X",(ulong)(uint)(this->step * (iVar3 + -1) + this->first));
    return;
  }
  uVar1 = this->first;
  StringBuilder::format
            (s,"<%X, %X, ..., %X>",(ulong)uVar1,(ulong)(this->step + uVar1),
             (ulong)(iVar3 * this->step + uVar1));
  return;
}

Assistant:

void format(StringBuilder &s) {
		if (N==0) {
		} else if (N<4) {
			for (int k=0; k<N-1; k++) {
				s.format("%X, ", first+step*k);
			}
			s.format("%X", first+step*(N-1));
		} else {
			int last = first + step * N;
			s.format("<%X, %X, ..., %X>", first, first + step, last);
		}
	}